

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_utffilter.h
# Opt level: O0

void __thiscall JSONUTF8StringFilter::push_back(JSONUTF8StringFilter *this,uchar ch)

{
  byte in_SIL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffe8;
  long lVar1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)&in_RDI->field_2 == 0) {
    if (in_SIL < 0x80) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (in_RDI,(char)((ulong)lVar1 >> 0x38));
    }
    else if (in_SIL < 0xc0) {
      *(undefined1 *)&in_RDI->_M_string_length = 0;
    }
    else if (in_SIL < 0xe0) {
      *(uint *)((long)&in_RDI->_M_string_length + 4) = (in_SIL & 0x1f) << 6;
      *(undefined4 *)&in_RDI->field_2 = 6;
    }
    else if (in_SIL < 0xf0) {
      *(uint *)((long)&in_RDI->_M_string_length + 4) = (in_SIL & 0xf) << 0xc;
      *(undefined4 *)&in_RDI->field_2 = 0xc;
    }
    else if (in_SIL < 0xf8) {
      *(uint *)((long)&in_RDI->_M_string_length + 4) = (in_SIL & 7) << 0x12;
      *(undefined4 *)&in_RDI->field_2 = 0x12;
    }
    else {
      *(undefined1 *)&in_RDI->_M_string_length = 0;
    }
  }
  else {
    if ((in_SIL & 0xc0) != 0x80) {
      *(undefined1 *)&in_RDI->_M_string_length = 0;
    }
    *(int *)&in_RDI->field_2 = *(int *)&in_RDI->field_2 + -6;
    *(uint *)((long)&in_RDI->_M_string_length + 4) =
         (in_SIL & 0x3f) << ((byte)*(undefined4 *)&in_RDI->field_2 & 0x1f) |
         *(uint *)((long)&in_RDI->_M_string_length + 4);
    if (*(int *)&in_RDI->field_2 == 0) {
      push_back_u((JSONUTF8StringFilter *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8),
                  (uint)((ulong)in_RDI >> 0x20));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void push_back(unsigned char ch)
    {
        if (state == 0) {
            if (ch < 0x80) // 7-bit ASCII, fast direct pass-through
                str.push_back(ch);
            else if (ch < 0xc0) // Mid-sequence character, invalid in this state
                is_valid = false;
            else if (ch < 0xe0) { // Start of 2-byte sequence
                codepoint = (ch & 0x1f) << 6;
                state = 6;
            } else if (ch < 0xf0) { // Start of 3-byte sequence
                codepoint = (ch & 0x0f) << 12;
                state = 12;
            } else if (ch < 0xf8) { // Start of 4-byte sequence
                codepoint = (ch & 0x07) << 18;
                state = 18;
            } else // Reserved, invalid
                is_valid = false;
        } else {
            if ((ch & 0xc0) != 0x80) // Not a continuation, invalid
                is_valid = false;
            state -= 6;
            codepoint |= (ch & 0x3f) << state;
            if (state == 0)
                push_back_u(codepoint);
        }
    }